

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

int filterResources(int *resourceList,int resourceCount,long preferenceFlags,long requirementFlags,
                   PairedList *possibleResources)

{
  size_t *psVar1;
  _List_node_base *__filename;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  _Self __tmp;
  long lVar6;
  int score;
  int iVar7;
  int iVar8;
  
  if (resourceCount == 0 || resourceList == (int *)0x0) {
    if (0 < rsrcList->length) {
      lVar6 = 0;
      do {
        iVar3 = 1;
        iVar4 = 0x20;
        iVar7 = 0;
        do {
          iVar7 = iVar7 + (uint)((rsrcList->list[lVar6].supportFlags & (long)iVar3) != 0 &&
                                (iVar3 & preferenceFlags) != 0);
          iVar3 = iVar3 * 2;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        p_Var2 = (_List_node_base *)operator_new(0x18);
        p_Var2[1]._M_next = (_List_node_base *)((ulong)(uint)-iVar7 | lVar6 << 0x20);
        std::__detail::_List_node_base::_M_hook(p_Var2);
        psVar1 = &(possibleResources->
                  super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < rsrcList->length);
    }
  }
  else if (0 < resourceCount) {
    uVar5 = 0;
    do {
      iVar3 = resourceList[uVar5];
      iVar4 = 1;
      iVar7 = 0x20;
      iVar8 = 0;
      do {
        iVar8 = iVar8 + (uint)((rsrcList->list[iVar3].supportFlags & (long)iVar4) != 0 &&
                              (iVar4 & preferenceFlags) != 0);
        iVar4 = iVar4 * 2;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      p_Var2 = (_List_node_base *)operator_new(0x18);
      p_Var2[1]._M_next = (_List_node_base *)CONCAT44(iVar3,-iVar8);
      std::__detail::_List_node_base::_M_hook(p_Var2);
      psVar1 = &(possibleResources->
                super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)resourceCount);
  }
  p_Var2 = (_List_node_base *)possibleResources;
  if (requirementFlags != 0) {
    do {
      p_Var2 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)possibleResources) break;
      if ((rsrcList->list[*(int *)((long)&p_Var2[1]._M_next + 4)].supportFlags & requirementFlags) <
          requirementFlags) {
        __filename = p_Var2 + 1;
        if (p_Var2 == (possibleResources->
                      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                      _M_impl._M_node.super__List_node_base._M_next) {
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
          p_Var2 = (possibleResources->
                   super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl._M_node.super__List_node_base._M_next;
        }
        else {
          p_Var2 = p_Var2->_M_prev;
          std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::remove
                    (possibleResources,(char *)__filename);
        }
      }
    } while (p_Var2 != (_List_node_base *)possibleResources);
  }
  iVar3 = -6;
  if ((possibleResources->
      super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl._M_node.
      _M_size != 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int filterResources(int* resourceList,
                    int resourceCount,
                    long preferenceFlags,
                    long requirementFlags,
                    PairedList* possibleResources) {

    // First determine a list of possible resources
    if (resourceList == NULL || resourceCount == 0) { // No list given
        for(int i=0; i<rsrcList->length; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[i].supportFlags), // Score
                i)); // ID
    } else {
        for(int i=0; i<resourceCount; i++)
            possibleResources->push_back(std::make_pair(
                scoreFlags(preferenceFlags,rsrcList->list[resourceList[i]].supportFlags), // Score
                resourceList[i])); // ID
    }

    if (requirementFlags != 0) { // If requirements given do restriction
        for(PairedList::iterator it = possibleResources->begin();
            it != possibleResources->end(); ++it) {
            int resource = (*it).second;
            long resourceFlag = rsrcList->list[resource].supportFlags;
            if ( (resourceFlag & requirementFlags) < requirementFlags) {
                if(it==possibleResources->begin()){
                    possibleResources->remove(*(it));
                    it=possibleResources->begin();
                }else
                    possibleResources->remove(*(it--));
            }
            if(it==possibleResources->end())
                break;
        }
    }

    if (possibleResources->size() == 0) {
        return BEAGLE_ERROR_NO_RESOURCE;
    }

    return BEAGLE_SUCCESS;
}